

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O0

size_t testbench::machine::availability::count(void)

{
  size_type sVar1;
  
  anon_unknown_0::factory_init();
  sVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    ((anonymous_namespace)::machines);
  return sVar1;
}

Assistant:

size_t machine::availability::count()
{
    factory_init();
    return machines->names.size();
}